

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckType(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Bool BVar1;
  char *local_148;
  ctmbstr valuesOL [4];
  ctmbstr valuesUL [4];
  ctmbstr valuesBUTTON [4];
  ctmbstr valuesINPUT [24];
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  memcpy(valuesBUTTON + 3,&DAT_001e1800,0xc0);
  valuesUL[3] = "button";
  valuesBUTTON[0] = "submit";
  valuesBUTTON[1] = "reset";
  valuesBUTTON[2] = (ctmbstr)0x0;
  valuesOL[3] = "disc";
  valuesUL[0] = "square";
  valuesUL[1] = "circle";
  valuesUL[2] = (ctmbstr)0x0;
  local_148 = "1";
  valuesOL[0] = "a";
  valuesOL[1] = "i";
  valuesOL[2] = (ctmbstr)0x0;
  if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_INPUT)) {
    if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_BUTTON))
    {
      if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_UL)) {
        if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_OL))
        {
          if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_LI)
             ) {
            if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
              prvTidyReportAttrError(doc,node,attval,0x256);
            }
            else {
              BVar1 = AttrValueIsAmong(attval,valuesOL + 3);
              if (BVar1 == no) {
                BVar1 = AttrValueIsAmong(attval,&local_148);
                if (BVar1 == no) {
                  prvTidyReportAttrError(doc,node,attval,0x22b);
                }
              }
              else {
                CheckLowerCaseAttrValue(doc,node,attval);
              }
            }
          }
        }
        else if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
          prvTidyReportAttrError(doc,node,attval,0x256);
        }
        else {
          BVar1 = AttrValueIsAmong(attval,&local_148);
          if (BVar1 == no) {
            prvTidyReportAttrError(doc,node,attval,0x22b);
          }
        }
      }
      else {
        CheckAttrValidity(doc,node,attval,valuesOL + 3);
      }
    }
    else {
      CheckAttrValidity(doc,node,attval,valuesUL + 3);
    }
  }
  else {
    CheckAttrValidity(doc,node,attval,valuesBUTTON + 3);
  }
  return;
}

Assistant:

void CheckType( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    ctmbstr const valuesINPUT[] = {
        "text", "password", "checkbox", "radio", "submit", "reset", "file",
        "hidden", "image", "button", "color", "date", "datetime",
        "datetime-local", "email", "month", "number", "range", "search",
        "tel", "time", "url", "week", NULL};
    ctmbstr const valuesBUTTON[] = {"button", "submit", "reset", NULL};
    ctmbstr const valuesUL[] = {"disc", "square", "circle", NULL};
    ctmbstr const valuesOL[] = {"1", "a", "i", NULL};

    if (nodeIsINPUT(node))
        CheckAttrValidity( doc, node, attval, valuesINPUT );
    else if (nodeIsBUTTON(node))
        CheckAttrValidity( doc, node, attval, valuesBUTTON );
    else if (nodeIsUL(node))
        CheckAttrValidity( doc, node, attval, valuesUL );
    else if (nodeIsOL(node))
    {
        if (!AttrHasValue(attval))
        {
            TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
            return;
        }
        if (!AttrValueIsAmong(attval, valuesOL))
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
    else if (nodeIsLI(node))
    {
        if (!AttrHasValue(attval))
        {
            TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
            return;
        }
        if (AttrValueIsAmong(attval, valuesUL))
            CheckLowerCaseAttrValue( doc, node, attval );
        else if (!AttrValueIsAmong(attval, valuesOL))
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
    return;
}